

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageInput.cpp
# Opt level: O0

ImageInput * __thiscall ImageInput::readImage(ImageInput *this,string *imagePath)

{
  byte bVar1;
  IReaderWriter *pIVar2;
  runtime_error *this_00;
  string *in_RDX;
  string local_48 [39];
  undefined1 local_21;
  string *imagePath_local;
  ImageInput *this_local;
  Mat *cvImage;
  
  local_21 = 0;
  imagePath_local = imagePath;
  this_local = this;
  pIVar2 = getReader((ImageInput *)imagePath);
  std::__cxx11::string::string(local_48,in_RDX);
  (**pIVar2->_vptr_IReaderWriter)(this,pIVar2,local_48);
  std::__cxx11::string::~string(local_48);
  bVar1 = cv::Mat::empty();
  if ((bVar1 & 1) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Invalid File Path");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return this;
}

Assistant:

cv::Mat ImageInput::readImage(std::string imagePath) {
  // get mat format of image from image reader
  cv::Mat cvImage = getReader()->read(imagePath);
  // check validity of image
  if (cvImage.empty()) {
    throw std::runtime_error("Invalid File Path");
  }
  return cvImage;
}